

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CMU462::Edge::getAxes(Edge *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  bool bVar1;
  pointer pHVar2;
  pointer pVVar3;
  reference pvVar4;
  pointer pFVar5;
  reference v;
  Vector3D local_170;
  Vector3D local_158;
  Vector3D local_140;
  Vector3D local_128;
  Vector3D local_110;
  _List_const_iterator<CMU462::Halfedge> local_f8;
  _List_const_iterator<CMU462::Halfedge> local_f0;
  _List_const_iterator<CMU462::Face> local_e8;
  FaceCIter f1;
  _List_const_iterator<CMU462::Face> local_d8;
  FaceCIter f0;
  Vector3D N1;
  Vector3D N0;
  Vector3D local_88;
  _List_const_iterator<CMU462::Halfedge> local_70;
  _List_const_iterator<CMU462::Halfedge> local_68;
  _List_const_iterator<CMU462::Vertex> local_60;
  undefined1 local_58 [8];
  Vector3D p1;
  _List_const_iterator<CMU462::Vertex> local_38;
  undefined1 local_30 [8];
  Vector3D p0;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes_local;
  Edge *this_local;
  
  p0.z = (double)axes;
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize(axes,3);
  p1.z = (double)halfedge(this);
  pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                     ((_List_const_iterator<CMU462::Halfedge> *)&p1.z);
  local_38._M_node = (_List_node_base *)Halfedge::vertex(pHVar2);
  pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_38);
  Vector3D::Vector3D((Vector3D *)local_30,&pVVar3->position);
  local_70._M_node = (_List_node_base *)halfedge(this);
  pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_70);
  local_68._M_node = (_List_node_base *)Halfedge::twin(pHVar2);
  pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_68);
  local_60._M_node = (_List_node_base *)Halfedge::vertex(pHVar2);
  pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_60);
  Vector3D::Vector3D((Vector3D *)local_58,&pVVar3->position);
  Vector3D::operator-((Vector3D *)&N0.z,(Vector3D *)local_58,(Vector3D *)local_30);
  Vector3D::unit(&local_88,(Vector3D *)&N0.z);
  pvVar4 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                     ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)p0.z,0);
  pvVar4->x = local_88.x;
  pvVar4->y = local_88.y;
  pvVar4->z = local_88.z;
  Vector3D::Vector3D((Vector3D *)&N1.z,0.0,0.0,0.0);
  Vector3D::Vector3D((Vector3D *)&f0,0.0,0.0,0.0);
  f1._M_node = (_List_node_base *)halfedge(this);
  pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                     ((_List_const_iterator<CMU462::Halfedge> *)&f1);
  local_d8._M_node = (_List_node_base *)Halfedge::face(pHVar2);
  local_f8._M_node = (_List_node_base *)halfedge(this);
  pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_f8);
  local_f0._M_node = (_List_node_base *)Halfedge::twin(pHVar2);
  pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_f0);
  local_e8._M_node = (_List_node_base *)Halfedge::face(pHVar2);
  pFVar5 = std::_List_const_iterator<CMU462::Face>::operator->(&local_d8);
  bVar1 = Face::isBoundary(pFVar5);
  if (!bVar1) {
    pFVar5 = std::_List_const_iterator<CMU462::Face>::operator->(&local_d8);
    Face::normal(&local_110,pFVar5);
    N1.z = local_110.x;
    N0.x = local_110.y;
    N0.y = local_110.z;
  }
  pFVar5 = std::_List_const_iterator<CMU462::Face>::operator->(&local_e8);
  bVar1 = Face::isBoundary(pFVar5);
  if (!bVar1) {
    pFVar5 = std::_List_const_iterator<CMU462::Face>::operator->(&local_e8);
    Face::normal(&local_128,pFVar5);
    f0._M_node = (_List_node_base *)local_128.x;
    N1.x = local_128.y;
    N1.y = local_128.z;
  }
  Vector3D::operator+(&local_158,(Vector3D *)&N1.z,(Vector3D *)&f0);
  Vector3D::unit(&local_140,&local_158);
  pvVar4 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                     ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)p0.z,2);
  pvVar4->x = local_140.x;
  pvVar4->y = local_140.y;
  pvVar4->z = local_140.z;
  pvVar4 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                     ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)p0.z,2);
  v = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)p0.z,0);
  cross(&local_170,pvVar4,v);
  pvVar4 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                     ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)p0.z,1);
  pvVar4->x = local_170.x;
  pvVar4->y = local_170.y;
  pvVar4->z = local_170.z;
  return;
}

Assistant:

void Edge::getAxes( vector<Vector3D>& axes ) const
  {
    axes.resize(3);

    // Set the X direction to the edge direction, with
    // orientation determined by the first halfedge.
    Vector3D p0 = halfedge()->vertex()->position;
    Vector3D p1 = halfedge()->twin()->vertex()->position;
    axes[0] = ( p1 - p0 ).unit();

    // For the Z direction, use the average of the two
    // incident triangles---or if we have a boundary edge,
    // just use the normal of the single interior face.
    Vector3D N0( 0., 0., 0. );
    Vector3D N1( 0., 0., 0. );
    FaceCIter f0 = halfedge()->face();
    FaceCIter f1 = halfedge()->twin()->face();
    if( !f0->isBoundary() ) N0 = f0->normal();
    if( !f1->isBoundary() ) N1 = f1->normal();
    axes[2] = ( N0 + N1 ).unit();

    // Choose the Y direction so that X x Y = Z
    axes[1] = cross( axes[2], axes[0] );
  }